

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::Copy(Compiler *this,Frag arg)

{
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  this->failed_ = true;
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_188,"Compiler::Copy called!",0x16);
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return (Frag)(ZEXT416(0) << 0x20);
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  failed_ = true;
  LOG(DFATAL) << "Compiler::Copy called!";
  return NoMatch();
}